

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void sf2cute::RIFF::WriteHeader(ostream *out,string *name,size_type size)

{
  undefined8 uVar1;
  length_error *this;
  long lVar2;
  exception *anon_var_0;
  iostate old_exception_bits;
  uint32_t local_20;
  size_type size_local;
  string *name_local;
  ostream *out_local;
  
  if (0xffffffff < size) {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"RIFF file size too large.");
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  std::ios::exceptions();
  uVar1 = *(undefined8 *)(*(long *)out + -0x18);
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions((int)out + (int)uVar1);
  std::ostream::write((char *)out,0x140523);
  local_20 = (uint32_t)size;
  InsertInt32L<std::ostream>(out,local_20);
  lVar2 = std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::ostream::write((char *)out,lVar2);
  return;
}

Assistant:

void RIFF::WriteHeader(std::ostream & out,
    const std::string & name,
    size_type size) {
  // Throw exception if the RIFF file size exceeds the maximum.
  if (size > UINT32_MAX) {
    throw std::length_error("RIFF file size too large.");
  }

  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the ID "RIFF".
    out.write("RIFF", 4);

    // Write the file size.
    InsertInt32L(out, static_cast<uint32_t>(size));

    // Write the form type.
    out.write(name.data(), name.size());
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}